

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackGenerator::DisplayVerboseOutput(cmCPackGenerator *this,string *msg,float progress)

{
  cmCPackLog *this_00;
  ostream *poVar1;
  size_t length;
  ostringstream cmCPackLog_msg;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  length = strlen((char *)local_1b0);
  cmCPackLog::Log(this_00,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x33,(char *)local_1b0,length);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmCPackGenerator::DisplayVerboseOutput(const std::string& msg,
                                            float progress)
{
  (void)progress;
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "" << msg << std::endl);
}